

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O3

QString * QSysInfo::buildCpuArchitecture(void)

{
  QString *in_RDI;
  
  (in_RDI->d).d = (Data *)0x0;
  (in_RDI->d).ptr = L"x86_64";
  (in_RDI->d).size = 6;
  return in_RDI;
}

Assistant:

QString QSysInfo::buildCpuArchitecture()
{
    return QStringLiteral(ARCH_PROCESSOR);
}